

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O0

unsigned_long kj::anon_unknown_55::parseInteger<unsigned_long>(StringPtr *s)

{
  unsigned_long max_00;
  unsigned_long_long uVar1;
  unsigned_long_long max;
  StringPtr *s_local;
  
  max_00 = MaxValue_::operator_cast_to_unsigned_long((MaxValue_ *)&maxValue);
  uVar1 = parseUnsigned(s,max_00);
  return uVar1;
}

Assistant:

T parseInteger(const StringPtr& s) {
  if (static_cast<T>(minValue) < 0) {
    long long min = static_cast<T>(minValue);
    long long max = static_cast<T>(maxValue);
    return static_cast<T>(parseSigned(s, min, max));
  } else {
    unsigned long long max = static_cast<T>(maxValue);
    return static_cast<T>(parseUnsigned(s, max));
  }
}